

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

bool __thiscall Parser::IsCurBlockInLoop(Parser *this)

{
  StmtNest *this_00;
  OpCode OVar1;
  uint uVar2;
  StmtNest **ppSVar3;
  
  ppSVar3 = &this->m_pstmtCur;
  while( true ) {
    this_00 = *ppSVar3;
    if (this_00 == (StmtNest *)0x0) {
      return false;
    }
    OVar1 = StmtNest::GetNop(this_00);
    uVar2 = ParseNode::Grfnop((uint)OVar1);
    if ((char)uVar2 < '\0') break;
    ppSVar3 = &this_00->pstmtOuter;
    if (OVar1 == knopFncDecl) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Parser::IsCurBlockInLoop() const
{
    for (StmtNest *stmt = this->m_pstmtCur; stmt != nullptr; stmt = stmt->pstmtOuter)
    {
        OpCode nop = stmt->GetNop();
        if (ParseNode::Grfnop(nop) & fnopContinue)
        {
            return true;
        }
        if (nop == knopFncDecl)
        {
            return false;
        }
    }
    return false;
}